

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_setup(mbedtls_ssl_context *ssl,mbedtls_ssl_config *conf)

{
  uchar *puVar1;
  size_t out_buf_len;
  size_t in_buf_len;
  int ret;
  mbedtls_ssl_config *conf_local;
  mbedtls_ssl_context *ssl_local;
  
  ssl->conf = conf;
  ssl_local._4_4_ = ssl_conf_check(ssl);
  if (ssl_local._4_4_ == 0) {
    ssl->tls_version = ssl->conf->max_tls_version;
    ssl->out_buf = (uchar *)0x0;
    puVar1 = (uchar *)calloc(1,0x42d);
    ssl->in_buf = puVar1;
    if (ssl->in_buf == (uchar *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x571,"alloc(%zu bytes) failed",0x42d);
      in_buf_len._4_4_ = -0x7f00;
    }
    else {
      puVar1 = (uchar *)calloc(1,0x42d);
      ssl->out_buf = puVar1;
      if (ssl->out_buf == (uchar *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x57b,"alloc(%zu bytes) failed",0x42d);
        in_buf_len._4_4_ = -0x7f00;
      }
      else {
        mbedtls_ssl_reset_in_out_pointers(ssl);
        in_buf_len._4_4_ = ssl_handshake_init(ssl);
        if (in_buf_len._4_4_ == 0) {
          return 0;
        }
      }
    }
    free(ssl->in_buf);
    free(ssl->out_buf);
    ssl->conf = (mbedtls_ssl_config *)0x0;
    ssl->in_buf = (uchar *)0x0;
    ssl->out_buf = (uchar *)0x0;
    ssl->in_hdr = (uchar *)0x0;
    ssl->in_ctr = (uchar *)0x0;
    ssl->in_len = (uchar *)0x0;
    ssl->in_iv = (uchar *)0x0;
    ssl->in_msg = (uchar *)0x0;
    ssl->out_hdr = (uchar *)0x0;
    ssl->out_ctr = (uchar *)0x0;
    ssl->out_len = (uchar *)0x0;
    ssl->out_iv = (uchar *)0x0;
    ssl->out_msg = (uchar *)0x0;
    ssl_local._4_4_ = in_buf_len._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_setup(mbedtls_ssl_context *ssl,
                      const mbedtls_ssl_config *conf)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t in_buf_len = MBEDTLS_SSL_IN_BUFFER_LEN;
    size_t out_buf_len = MBEDTLS_SSL_OUT_BUFFER_LEN;

    ssl->conf = conf;

    if ((ret = ssl_conf_check(ssl)) != 0) {
        return ret;
    }
    ssl->tls_version = ssl->conf->max_tls_version;

    /*
     * Prepare base structures
     */

    /* Set to NULL in case of an error condition */
    ssl->out_buf = NULL;

#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
    ssl->in_buf_len = in_buf_len;
#endif
    ssl->in_buf = mbedtls_calloc(1, in_buf_len);
    if (ssl->in_buf == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("alloc(%" MBEDTLS_PRINTF_SIZET " bytes) failed", in_buf_len));
        ret = MBEDTLS_ERR_SSL_ALLOC_FAILED;
        goto error;
    }

#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
    ssl->out_buf_len = out_buf_len;
#endif
    ssl->out_buf = mbedtls_calloc(1, out_buf_len);
    if (ssl->out_buf == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("alloc(%" MBEDTLS_PRINTF_SIZET " bytes) failed", out_buf_len));
        ret = MBEDTLS_ERR_SSL_ALLOC_FAILED;
        goto error;
    }

    mbedtls_ssl_reset_in_out_pointers(ssl);

#if defined(MBEDTLS_SSL_DTLS_SRTP)
    memset(&ssl->dtls_srtp_info, 0, sizeof(ssl->dtls_srtp_info));
#endif

    if ((ret = ssl_handshake_init(ssl)) != 0) {
        goto error;
    }

    return 0;

error:
    mbedtls_free(ssl->in_buf);
    mbedtls_free(ssl->out_buf);

    ssl->conf = NULL;

#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
    ssl->in_buf_len = 0;
    ssl->out_buf_len = 0;
#endif
    ssl->in_buf = NULL;
    ssl->out_buf = NULL;

    ssl->in_hdr = NULL;
    ssl->in_ctr = NULL;
    ssl->in_len = NULL;
    ssl->in_iv = NULL;
    ssl->in_msg = NULL;

    ssl->out_hdr = NULL;
    ssl->out_ctr = NULL;
    ssl->out_len = NULL;
    ssl->out_iv = NULL;
    ssl->out_msg = NULL;

    return ret;
}